

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

PropertyID lunasvg::csspropertyid(string_view *name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  PropertyID PVar2;
  difference_type __d;
  ulong uVar3;
  anon_struct_24_2_b8fd76e8 *paVar4;
  ulong uVar5;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  
  paVar4 = csspropertyid::table;
  uVar3 = 0x23;
  while (uVar5 = uVar3, 0 < (long)uVar5) {
    uVar3 = uVar5 >> 1;
    __y._M_len = name->_M_len;
    __y._M_str = name->_M_str;
    __x_00._M_str = paVar4[uVar3].name._M_str;
    __x_00._M_len = paVar4[uVar3].name._M_len;
    bVar1 = std::operator<(__x_00,__y);
    if (bVar1) {
      paVar4 = paVar4 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar5;
    }
  }
  if ((paVar4 == (anon_struct_24_2_b8fd76e8 *)&DAT_00155cc8) ||
     (__x._M_len = (paVar4->name)._M_len, __x._M_str = (paVar4->name)._M_str,
     __y_00._M_len = name->_M_len, __y_00._M_str = name->_M_str, bVar1 = std::operator!=(__x,__y_00)
     , bVar1)) {
    PVar2 = Unknown;
  }
  else {
    PVar2 = paVar4->value;
  }
  return PVar2;
}

Assistant:

PropertyID csspropertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"alignment-baseline", PropertyID::Alignment_Baseline},
        {"baseline-shift", PropertyID::Baseline_Shift},
        {"clip-path", PropertyID::Clip_Path},
        {"clip-rule", PropertyID::Clip_Rule},
        {"color", PropertyID::Color},
        {"direction", PropertyID::Direction},
        {"display", PropertyID::Display},
        {"dominant-baseline", PropertyID::Dominant_Baseline},
        {"fill", PropertyID::Fill},
        {"fill-opacity", PropertyID::Fill_Opacity},
        {"fill-rule", PropertyID::Fill_Rule},
        {"font-family", PropertyID::Font_Family},
        {"font-size", PropertyID::Font_Size},
        {"font-style", PropertyID::Font_Style},
        {"font-weight", PropertyID::Font_Weight},
        {"marker-end", PropertyID::Marker_End},
        {"marker-mid", PropertyID::Marker_Mid},
        {"marker-start", PropertyID::Marker_Start},
        {"mask", PropertyID::Mask},
        {"mask-type", PropertyID::Mask_Type},
        {"opacity", PropertyID::Opacity},
        {"overflow", PropertyID::Overflow},
        {"stop-color", PropertyID::Stop_Color},
        {"stop-opacity", PropertyID::Stop_Opacity},
        {"stroke", PropertyID::Stroke},
        {"stroke-dasharray", PropertyID::Stroke_Dasharray},
        {"stroke-dashoffset", PropertyID::Stroke_Dashoffset},
        {"stroke-linecap", PropertyID::Stroke_Linecap},
        {"stroke-linejoin", PropertyID::Stroke_Linejoin},
        {"stroke-miterlimit", PropertyID::Stroke_Miterlimit},
        {"stroke-opacity", PropertyID::Stroke_Opacity},
        {"stroke-width", PropertyID::Stroke_Width},
        {"text-anchor", PropertyID::Text_Anchor},
        {"visibility", PropertyID::Visibility},
        {"white-space", PropertyID::WhiteSpace}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return PropertyID::Unknown;
    return it->value;
}